

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double insphere(double *pa,double *pb,double *pc,double *pd,double *pe)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double errbound;
  double permanent;
  double dexbeyplus;
  double bexdeyplus;
  double cexaeyplus;
  double aexceyplus;
  double aexdeyplus;
  double dexaeyplus;
  double dexceyplus;
  double cexdeyplus;
  double cexbeyplus;
  double bexceyplus;
  double bexaeyplus;
  double aexbeyplus;
  double dezplus;
  double cezplus;
  double bezplus;
  double aezplus;
  double det;
  double dab;
  double cda;
  double bcd;
  double abc;
  double bd;
  double ac;
  double da;
  double cd;
  double bc;
  double ab;
  double dlift;
  double clift;
  double blift;
  double alift;
  double dexbey;
  double bexdey;
  double cexaey;
  double aexcey;
  double aexdey;
  double dexaey;
  double dexcey;
  double cexdey;
  double cexbey;
  double bexcey;
  double bexaey;
  double aexbey;
  double dez;
  double cez;
  double bez;
  double aez;
  double dey;
  double cey;
  double bey;
  double aey;
  double dex;
  double cex;
  double bex;
  double aex;
  double *pe_local;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = *pa - *pe;
  dVar2 = *pb - *pe;
  dVar3 = *pc - *pe;
  dVar4 = *pd - *pe;
  dVar5 = pa[1] - pe[1];
  dVar6 = pb[1] - pe[1];
  dVar7 = pc[1] - pe[1];
  dVar8 = pd[1] - pe[1];
  dVar9 = pa[2] - pe[2];
  dVar10 = pb[2] - pe[2];
  dVar11 = pc[2] - pe[2];
  dVar12 = pd[2] - pe[2];
  dVar13 = dVar1 * dVar6 - dVar2 * dVar5;
  dVar14 = dVar2 * dVar7 - dVar3 * dVar6;
  dVar15 = dVar3 * dVar8 - dVar4 * dVar7;
  dVar16 = dVar4 * dVar5 - dVar1 * dVar8;
  dVar17 = dVar1 * dVar7 - dVar3 * dVar5;
  dVar18 = dVar2 * dVar8 - dVar4 * dVar6;
  dVar19 = dVar9 * dVar9 + dVar1 * dVar1 + dVar5 * dVar5;
  dVar20 = dVar10 * dVar10 + dVar2 * dVar2 + dVar6 * dVar6;
  dVar21 = dVar11 * dVar11 + dVar3 * dVar3 + dVar7 * dVar7;
  dVar22 = dVar12 * dVar12 + dVar4 * dVar4 + dVar8 * dVar8;
  pa_local = (double *)
             (dVar22 * (dVar11 * dVar13 + dVar9 * dVar14 + -(dVar10 * dVar17)) +
              -(dVar21 * (dVar10 * dVar16 + dVar12 * dVar13 + dVar9 * dVar18)) +
             dVar20 * (dVar9 * dVar15 + dVar11 * dVar16 + dVar12 * dVar17) +
             -(dVar19 * (dVar12 * dVar14 + dVar10 * dVar15 + -(dVar11 * dVar18))));
  if ((_use_inexact_arith == 0) &&
     ((_use_static_filter == 0 || (ABS((double)pa_local) <= ispstaticfilter)))) {
    dVar9 = ABS(dVar9);
    dVar10 = ABS(dVar10);
    dVar11 = ABS(dVar11);
    dVar12 = ABS(dVar12);
    dVar13 = ABS(dVar1 * dVar6);
    dVar14 = ABS(dVar2 * dVar5);
    dVar15 = ABS(dVar2 * dVar7);
    dVar16 = ABS(dVar3 * dVar6);
    dVar17 = ABS(dVar3 * dVar8);
    dVar18 = ABS(dVar4 * dVar7);
    dVar23 = ABS(dVar4 * dVar5);
    dVar24 = ABS(dVar1 * dVar8);
    dVar1 = ABS(dVar1 * dVar7);
    dVar3 = ABS(dVar3 * dVar5);
    dVar2 = ABS(dVar2 * dVar8);
    dVar4 = ABS(dVar4 * dVar6);
    dVar1 = ((dVar13 + dVar14) * dVar11 + (dVar15 + dVar16) * dVar9 + (dVar3 + dVar1) * dVar10) *
            dVar22 + ((dVar23 + dVar24) * dVar10 +
                     (dVar13 + dVar14) * dVar12 + (dVar2 + dVar4) * dVar9) * dVar21 +
                     ((dVar15 + dVar16) * dVar12 +
                     (dVar17 + dVar18) * dVar10 + (dVar4 + dVar2) * dVar11) * dVar19 +
                     ((dVar17 + dVar18) * dVar9 +
                     (dVar23 + dVar24) * dVar11 + (dVar1 + dVar3) * dVar12) * dVar20;
    dVar2 = isperrboundA * dVar1;
    if (((double)pa_local <= dVar2) && (-(double)pa_local <= dVar2)) {
      pa_local = (double *)insphereadapt(pa,pb,pc,pd,pe,dVar1);
    }
  }
  return (double)pa_local;
}

Assistant:

REAL insphere(REAL *pa, REAL *pb, REAL *pc, REAL *pd, REAL *pe)
{
  REAL aex, bex, cex, dex;
  REAL aey, bey, cey, dey;
  REAL aez, bez, cez, dez;
  REAL aexbey, bexaey, bexcey, cexbey, cexdey, dexcey, dexaey, aexdey;
  REAL aexcey, cexaey, bexdey, dexbey;
  REAL alift, blift, clift, dlift;
  REAL ab, bc, cd, da, ac, bd;
  REAL abc, bcd, cda, dab;
  REAL det;


  aex = pa[0] - pe[0];
  bex = pb[0] - pe[0];
  cex = pc[0] - pe[0];
  dex = pd[0] - pe[0];
  aey = pa[1] - pe[1];
  bey = pb[1] - pe[1];
  cey = pc[1] - pe[1];
  dey = pd[1] - pe[1];
  aez = pa[2] - pe[2];
  bez = pb[2] - pe[2];
  cez = pc[2] - pe[2];
  dez = pd[2] - pe[2];

  aexbey = aex * bey;
  bexaey = bex * aey;
  ab = aexbey - bexaey;
  bexcey = bex * cey;
  cexbey = cex * bey;
  bc = bexcey - cexbey;
  cexdey = cex * dey;
  dexcey = dex * cey;
  cd = cexdey - dexcey;
  dexaey = dex * aey;
  aexdey = aex * dey;
  da = dexaey - aexdey;

  aexcey = aex * cey;
  cexaey = cex * aey;
  ac = aexcey - cexaey;
  bexdey = bex * dey;
  dexbey = dex * bey;
  bd = bexdey - dexbey;

  abc = aez * bc - bez * ac + cez * ab;
  bcd = bez * cd - cez * bd + dez * bc;
  cda = cez * da + dez * ac + aez * cd;
  dab = dez * ab + aez * bd + bez * da;

  alift = aex * aex + aey * aey + aez * aez;
  blift = bex * bex + bey * bey + bez * bez;
  clift = cex * cex + cey * cey + cez * cez;
  dlift = dex * dex + dey * dey + dez * dez;

  det = (dlift * abc - clift * dab) + (blift * cda - alift * bcd);

  if (_use_inexact_arith) {
    return det;
  }

  if (_use_static_filter) {
    if (fabs(det) > ispstaticfilter) return det;
    //if (det > ispstaticfilter) return det;
    //if (det < minus_ispstaticfilter) return det;

  }

  REAL aezplus, bezplus, cezplus, dezplus;
  REAL aexbeyplus, bexaeyplus, bexceyplus, cexbeyplus;
  REAL cexdeyplus, dexceyplus, dexaeyplus, aexdeyplus;
  REAL aexceyplus, cexaeyplus, bexdeyplus, dexbeyplus;
  REAL permanent, errbound;

  aezplus = Absolute(aez);
  bezplus = Absolute(bez);
  cezplus = Absolute(cez);
  dezplus = Absolute(dez);
  aexbeyplus = Absolute(aexbey);
  bexaeyplus = Absolute(bexaey);
  bexceyplus = Absolute(bexcey);
  cexbeyplus = Absolute(cexbey);
  cexdeyplus = Absolute(cexdey);
  dexceyplus = Absolute(dexcey);
  dexaeyplus = Absolute(dexaey);
  aexdeyplus = Absolute(aexdey);
  aexceyplus = Absolute(aexcey);
  cexaeyplus = Absolute(cexaey);
  bexdeyplus = Absolute(bexdey);
  dexbeyplus = Absolute(dexbey);
  permanent = ((cexdeyplus + dexceyplus) * bezplus
               + (dexbeyplus + bexdeyplus) * cezplus
               + (bexceyplus + cexbeyplus) * dezplus)
            * alift
            + ((dexaeyplus + aexdeyplus) * cezplus
               + (aexceyplus + cexaeyplus) * dezplus
               + (cexdeyplus + dexceyplus) * aezplus)
            * blift
            + ((aexbeyplus + bexaeyplus) * dezplus
               + (bexdeyplus + dexbeyplus) * aezplus
               + (dexaeyplus + aexdeyplus) * bezplus)
            * clift
            + ((bexceyplus + cexbeyplus) * aezplus
               + (cexaeyplus + aexceyplus) * bezplus
               + (aexbeyplus + bexaeyplus) * cezplus)
            * dlift;
  errbound = isperrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return insphereadapt(pa, pb, pc, pd, pe, permanent);
}